

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emu2149.c
# Opt level: O0

void EPSG_calc_stereo(EPSG *psg,UINT32 samples,DEV_SMPL **out)

{
  DEV_SMPL *pDVar1;
  uint local_3c;
  DEV_SMPL local_38;
  UINT32 i;
  int32_t buffers [2];
  DEV_SMPL *bufRO;
  DEV_SMPL *bufMO;
  DEV_SMPL **out_local;
  UINT32 samples_local;
  EPSG *psg_local;
  
  pDVar1 = *out;
  buffers = *(int32_t (*) [2])(out + 1);
  if (psg->quality == 0) {
    for (local_3c = 0; local_3c < samples; local_3c = local_3c + 1) {
      update_output(psg);
      mix_output_stereo(psg,&local_38);
      pDVar1[local_3c] = local_38;
      *(UINT32 *)((long)buffers + (ulong)local_3c * 4) = i;
    }
  }
  else {
    for (local_3c = 0; local_3c < samples; local_3c = local_3c + 1) {
      while (psg->psgtime < psg->realstep) {
        psg->psgtime = psg->psgstep + psg->psgtime;
        psg->sprev[0] = psg->snext[0];
        psg->sprev[1] = psg->snext[1];
        update_output(psg);
        mix_output_stereo(psg,psg->snext);
      }
      psg->psgtime = psg->psgtime - psg->realstep;
      pDVar1[local_3c] =
           (int)(((double)psg->snext[0] * (double)(psg->psgstep - psg->psgtime) +
                 (double)psg->sprev[0] * (double)psg->psgtime) / (double)psg->psgstep);
      *(int *)((long)buffers + (ulong)local_3c * 4) =
           (int)(((double)psg->snext[1] * (double)(psg->psgstep - psg->psgtime) +
                 (double)psg->sprev[1] * (double)psg->psgtime) / (double)psg->psgstep);
    }
  }
  return;
}

Assistant:

void
EPSG_calc_stereo (EPSG * psg, UINT32 samples, DEV_SMPL **out)
{
  DEV_SMPL *bufMO = out[0];
  DEV_SMPL *bufRO = out[1];
  int32_t buffers[2];
  UINT32 i;

  if (!psg->quality)
  {
    for (i = 0; i < samples; i ++)
    {
      update_output(psg);
      mix_output_stereo(psg, buffers);
      bufMO[i] = buffers[0];
      bufRO[i] = buffers[1];
    }
  }
  else
  {
    for (i = 0; i < samples; i ++)
    {
      while (psg->realstep > psg->psgtime)
      { 
        psg->psgtime += psg->psgstep;
        psg->sprev[0] = psg->snext[0];
        psg->sprev[1] = psg->snext[1];
        update_output(psg);
        mix_output_stereo(psg, psg->snext);
      }

      psg->psgtime -= psg->realstep;
      bufMO[i] = (DEV_SMPL) (((double) psg->snext[0] * (psg->psgstep - psg->psgtime)
                            + (double) psg->sprev[0] * psg->psgtime) / psg->psgstep);
      bufRO[i] = (DEV_SMPL) (((double) psg->snext[1] * (psg->psgstep - psg->psgtime)
                            + (double) psg->sprev[1] * psg->psgtime) / psg->psgstep);
    }
  }
}